

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O2

void prettyPrintMachine(Machine *m)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  _Rb_tree_node_base *p_Var3;
  _Rb_tree_node_base *p_Var4;
  undefined1 local_d0 [48];
  undefined1 local_a0 [48];
  undefined1 local_70 [8];
  pair<const_Hix,_Hcell> it;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"H: ");
  operator<<(poVar1,(Hix)(m->h).hix);
  poVar1 = std::operator<<(poVar1,"|S: ");
  operator<<(poVar1,(Hix)(m->s).hix);
  std::operator<<(poVar1,"\n");
  std::operator<<((ostream *)&std::cout,"Heap:\n");
  it.second.f_._32_8_ = m;
  for (p_Var2 = (m->heap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(m->heap)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    std::pair<const_Hix,_Hcell>::pair
              ((pair<const_Hix,_Hcell> *)local_70,(pair<const_Hix,_Hcell> *)(p_Var2 + 1));
    operator<<((ostream *)&std::cout,(Hix)local_70._0_4_);
    poVar1 = std::operator<<((ostream *)&std::cout," -> ");
    Hcell::Hcell((Hcell *)local_d0,(Hcell *)&it);
    Hcell::print((Hcell *)local_d0,poVar1);
    std::__cxx11::string::~string((string *)(local_d0 + 8));
    std::operator<<((ostream *)&std::cout,"\n");
    std::__cxx11::string::~string((string *)&it.second);
  }
  std::operator<<((ostream *)&std::cout,"\n--\n");
  std::operator<<((ostream *)&std::cout,"Registers:\n");
  p_Var4 = (_Rb_tree_node_base *)(it.second.f_._32_8_ + 0x38);
  for (p_Var3 = *(_Rb_tree_node_base **)(it.second.f_._32_8_ + 0x48); p_Var3 != p_Var4;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    std::pair<const_Register,_Hcell>::pair
              ((pair<const_Register,_Hcell> *)local_70,(pair<const_Register,_Hcell> *)(p_Var3 + 1));
    operator<<((ostream *)&std::cout,(Register)local_70._0_4_);
    poVar1 = std::operator<<((ostream *)&std::cout," -> ");
    Hcell::Hcell((Hcell *)local_a0,(Hcell *)&it);
    Hcell::print((Hcell *)local_a0,poVar1);
    std::__cxx11::string::~string((string *)(local_a0 + 8));
    std::operator<<((ostream *)&std::cout,"\n");
    std::__cxx11::string::~string((string *)&it.second);
  }
  std::operator<<((ostream *)&std::cout,"\n--\n");
  return;
}

Assistant:

void prettyPrintMachine(Machine m) {
    // H, S
    std::cout << "H: " << m.h << "|S: " << m.s << "\n";

    std::cout << "Heap:\n";
    for (auto it : m.heap) {
        std::cout << it.first << " -> " << it.second;
        std::cout << "\n";
    }
    std::cout << "\n--\n";

    std::cout << "Registers:\n";
    for (auto it : m.regval) {
        std::cout << it.first << " -> " << it.second;
        std::cout << "\n";
    }
    std::cout << "\n--\n";
}